

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-font.c
# Opt level: O1

pdf_font_desc * pdf_load_font(hd_context *ctx,pdf_document *doc,pdf_obj *dict)

{
  hd_error_stack_slot *phVar1;
  int iVar2;
  pdf_obj *a;
  pdf_obj *ppVar3;
  pdf_obj *ppVar4;
  pdf_obj *extraout_RDX;
  pdf_obj *extraout_RDX_00;
  pdf_obj *extraout_RDX_01;
  pdf_obj *dict_00;
  pdf_font_desc *fontdesc;
  pdf_font_desc *local_38;
  
  local_38 = (pdf_font_desc *)0x0;
  local_38 = (pdf_font_desc *)pdf_find_item(ctx,pdf_drop_font_imp,dict);
  if (local_38 != (pdf_font_desc *)0x0) {
    return local_38;
  }
  a = pdf_dict_get(ctx,dict,(pdf_obj *)0x149);
  ppVar3 = pdf_dict_get(ctx,dict,(pdf_obj *)0x69);
  ppVar4 = pdf_dict_get(ctx,dict,(pdf_obj *)0x48);
  hd_var_imp(&local_38);
  iVar2 = hd_push_try(ctx);
  if ((iVar2 == 0) || (iVar2 = __sigsetjmp(ctx->error->top->buffer,0), iVar2 != 0))
  goto LAB_001136d2;
  dict_00 = extraout_RDX;
  if ((a == (pdf_obj *)0x15a) ||
     (((pdf_obj *)0x185 < a &&
      (iVar2 = pdf_objcmp_resolve(ctx,a,(pdf_obj *)0x15a), dict_00 = extraout_RDX_00, iVar2 == 0))))
  {
LAB_001136a5:
    local_38 = pdf_load_type0_font(ctx,(pdf_document *)dict,dict_00);
    goto LAB_001136d2;
  }
  if ((a == (pdf_obj *)0x15b) ||
     ((((((pdf_obj *)0x185 < a && (iVar2 = pdf_objcmp_resolve(ctx,a,(pdf_obj *)0x15b), iVar2 == 0))
        || (a == (pdf_obj *)0xe7)) ||
       (((pdf_obj *)0x185 < a && (iVar2 = pdf_objcmp_resolve(ctx,a,(pdf_obj *)0xe7), iVar2 == 0))))
      || ((a == (pdf_obj *)0x157 ||
          (((pdf_obj *)0x185 < a && (iVar2 = pdf_objcmp_resolve(ctx,a,(pdf_obj *)0x157), iVar2 == 0)
           ))))))) {
LAB_001136c3:
    local_38 = pdf_load_simple_font_by_name(ctx,dict);
  }
  else {
    if ((a != (pdf_obj *)0x15d) &&
       ((a < (pdf_obj *)0x186 || (iVar2 = pdf_objcmp_resolve(ctx,a,(pdf_obj *)0x15d), iVar2 != 0))))
    {
      if (ppVar4 == (pdf_obj *)0x0) {
        if (ppVar3 != (pdf_obj *)0x0) {
          hd_warn(ctx,"unknown font format, guessing type0.");
          dict_00 = extraout_RDX_01;
          goto LAB_001136a5;
        }
        hd_warn(ctx,"unknown font format, guessing type1 or truetype.");
        goto LAB_001136c3;
      }
      hd_warn(ctx,"unknown font format, guessing type3.");
    }
    local_38 = (pdf_font_desc *)0x0;
  }
LAB_001136d2:
  phVar1 = ctx->error->top;
  ctx->error->top = phVar1 + -1;
  if (phVar1->code < 2) {
    if (local_38 != (pdf_font_desc *)0x0) {
      pdf_store_item(ctx,dict,local_38,local_38->size);
    }
    return local_38;
  }
  pdf_drop_font(ctx,local_38);
  hd_rethrow(ctx);
}

Assistant:

pdf_font_desc *
pdf_load_font(hd_context *ctx, pdf_document *doc, pdf_obj *dict)
{
    pdf_obj *subtype;
    pdf_obj *dfonts;
    pdf_obj *charprocs;
    pdf_font_desc *fontdesc = NULL;

    if ((fontdesc = pdf_find_item(ctx, pdf_drop_font_imp, dict)) != NULL)
    {
        return fontdesc;
    }

    subtype = pdf_dict_get(ctx, dict, PDF_NAME_Subtype);
    dfonts = pdf_dict_get(ctx, dict, PDF_NAME_DescendantFonts);
    charprocs = pdf_dict_get(ctx, dict, PDF_NAME_CharProcs);

    hd_var(fontdesc);

    hd_try(ctx)
    {
        //TODO:pdf_load_type3_font;
        if (pdf_name_eq(ctx, subtype, PDF_NAME_Type0))
            fontdesc = pdf_load_type0_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_Type1))
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_MMType1))
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_TrueType))
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        else if (pdf_name_eq(ctx, subtype, PDF_NAME_Type3))
        {
            fontdesc = NULL;
        }
        else if (charprocs)
        {
            hd_warn(ctx, "unknown font format, guessing type3.");
            fontdesc = NULL;
        }
        else if (dfonts)
        {
            hd_warn(ctx, "unknown font format, guessing type0.");
            fontdesc = pdf_load_type0_font(ctx, doc, dict);
        }
        else
        {
            hd_warn(ctx, "unknown font format, guessing type1 or truetype.");
            fontdesc = pdf_load_simple_font(ctx, doc, dict);
        }

    }
    hd_catch(ctx)
    {
        pdf_drop_font(ctx, fontdesc);
        hd_rethrow(ctx);
    }

    if (fontdesc != NULL)
        pdf_store_item(ctx, dict, fontdesc, fontdesc->size);

    return fontdesc;
}